

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O1

bool __thiscall FIX::Message::isApp(Message *this)

{
  bool bVar1;
  void *pvVar2;
  MsgType msgType;
  FieldBase local_68;
  
  StringField::StringField((StringField *)&local_68,0x23);
  local_68._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f9500;
  bVar1 = FieldMap::getFieldIfSet(&(this->m_header).super_FieldMap,&local_68);
  if (bVar1) {
    bVar1 = true;
    if (local_68.m_string._M_string_length == 1) {
      pvVar2 = memchr("0A12345",(int)*local_68.m_string._M_dataplus._M_p,8);
      bVar1 = pvVar2 == (void *)0x0;
    }
  }
  else {
    bVar1 = false;
  }
  FieldBase::~FieldBase(&local_68);
  return bVar1;
}

Assistant:

bool isApp() const {
    MsgType msgType;
    if (m_header.getFieldIfSet(msgType)) {
      return !isAdminMsgType(msgType);
    }
    return false;
  }